

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# txt_to_cpp.cpp
# Opt level: O3

int usage(char *prg,char *msg,int res)

{
  size_t sVar1;
  
  if (msg != (char *)0x0) {
    sVar1 = strlen(msg);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,msg,sVar1);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x48);
    std::ostream::put(-0x48);
    std::ostream::flush();
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Usage:",6);
  std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x48);
  std::ostream::put(-0x48);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"  ",2);
  if (prg == (char *)0x0) {
    std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x1050b8);
  }
  else {
    sVar1 = strlen(prg);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,prg,sVar1);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr," output_file input_file cpp_var_name",0x24);
  std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x48);
  std::ostream::put(-0x48);
  std::ostream::flush();
  return res;
}

Assistant:

int usage( const char *prg, const char *msg, int res ) {
    if ( msg )
        std::cerr << msg << std::endl;
    std::cerr << "Usage:" << std::endl;
    std::cerr << "  " << prg << " output_file input_file cpp_var_name" << std::endl;
    return res;
}